

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O0

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<1,_10,_1>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int in_ECX;
  float local_b8;
  VecAccess<float,_4,_3> local_b0;
  Matrix<float,_4,_3> local_98;
  Vector<float,_3> local_68 [2];
  float local_4c;
  undefined1 local_48 [4];
  Type_conflict in1;
  Type in0;
  InputType in1Type_local;
  InputType in0Type_local;
  ShaderEvalContext *evalCtx_local;
  
  in0.m_data.m_data[2].m_data[2] = (float)in1Type;
  in0.m_data.m_data[2].m_data[3] = (float)in0Type;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,10>
              ((Mat3x4 *)local_48,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX);
  }
  else {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<0,10>
              ((Mat3x4 *)local_48,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX);
  }
  if (in0.m_data.m_data[2].m_data[2] == 2.8026e-45) {
    local_b8 = sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,1>(evalCtx,1);
  }
  else {
    local_b8 = sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<0,1>(evalCtx,1);
  }
  local_4c = local_b8;
  tcu::operator-(&local_98,(Matrix<float,_4,_3> *)local_48,local_b8);
  reduceToVec3((MatrixCaseUtils *)local_68,&local_98);
  tcu::Vector<float,_4>::xyz(&local_b0,&evalCtx->color);
  tcu::VecAccess<float,_4,_3>::operator=(&local_b0,local_68);
  tcu::Matrix<float,_4,_3>::~Matrix(&local_98);
  tcu::Matrix<float,_4,_3>::~Matrix((Matrix<float,_4,_3> *)local_48);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 - in1);
	}